

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyAuxRef.cpp
# Opt level: O2

void __thiscall chrono::ChBodyAuxRef::ArchiveIN(ChBodyAuxRef *this,ChArchiveIn *marchive)

{
  ChNameValue<chrono::ChFrameMoving<double>_> local_48;
  ChNameValue<chrono::ChFrameMoving<double>_> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChBodyAuxRef>(marchive);
  ChBody::ArchiveIN(&this->super_ChBody,marchive);
  local_30._value = &this->auxref_to_cog;
  local_30._name = "auxref_to_cog";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->auxref_to_abs;
  local_48._name = "auxref_to_abs";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  return;
}

Assistant:

void ChBodyAuxRef::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChBodyAuxRef>();

    // deserialize parent class
    ChBody::ArchiveIN(marchive);

    // stream in all member data:
    marchive >> CHNVP(auxref_to_cog);
    marchive >> CHNVP(auxref_to_abs);
}